

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxis.cpp
# Opt level: O1

bool __thiscall DIS::GridAxis::operator==(GridAxis *this,GridAxis *rhs)

{
  return ((((this->_axisType == rhs->_axisType && this->_interleafFactor == rhs->_interleafFactor)
           && (this->_initialIndex == rhs->_initialIndex &&
              rhs->_numberOfPointsOnXiAxis == this->_numberOfPointsOnXiAxis)) &&
          this->_domainPointsXi == rhs->_domainPointsXi) &&
         this->_domainFinalXi == rhs->_domainFinalXi) &&
         this->_domainInitialXi == rhs->_domainInitialXi;
}

Assistant:

bool GridAxis::operator ==(const GridAxis& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_domainInitialXi == rhs._domainInitialXi) ) ivarsEqual = false;
     if( ! (_domainFinalXi == rhs._domainFinalXi) ) ivarsEqual = false;
     if( ! (_domainPointsXi == rhs._domainPointsXi) ) ivarsEqual = false;
     if( ! (_interleafFactor == rhs._interleafFactor) ) ivarsEqual = false;
     if( ! (_axisType == rhs._axisType) ) ivarsEqual = false;
     if( ! (_numberOfPointsOnXiAxis == rhs._numberOfPointsOnXiAxis) ) ivarsEqual = false;
     if( ! (_initialIndex == rhs._initialIndex) ) ivarsEqual = false;

    return ivarsEqual;
 }